

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O2

void __thiscall
boomphf::file_binary<unsigned_long>::file_binary(file_binary<unsigned_long> *this,char *filename)

{
  FILE *pFVar1;
  invalid_argument *this_00;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pFVar1 = fopen(filename,"rb");
  this->_is = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_58,filename,&local_59);
  std::operator+(&local_38,"Error opening ",&local_58);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

file_binary(const char* filename)
		{
			_is = fopen(filename, "rb");

			if (!_is) {
				throw std::invalid_argument("Error opening " + std::string(filename));
			}
		}